

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O2

int32_t __thiscall
icu_63::UnicodeSet::spanBack
          (UnicodeSet *this,UChar *s,int32_t length,USetSpanCondition spanCondition)

{
  UBool UVar1;
  int32_t iVar2;
  UChar *pUVar3;
  uint uVar4;
  uint c;
  UnicodeSetStringSpan strSpan;
  
  iVar2 = (int32_t)&strSpan;
  if (length < 1) {
    if (-1 < length) {
      return 0;
    }
    length = u_strlen_63(s);
    if (length == 0) {
      return 0;
    }
  }
  else if (this->bmpSet != (BMPSet *)0x0) {
    pUVar3 = BMPSet::spanBack(this->bmpSet,s,s + (uint)length,spanCondition);
    return (int32_t)((ulong)((long)pUVar3 - (long)s) >> 1);
  }
  if (this->stringSpan != (UnicodeSetStringSpan *)0x0) {
    iVar2 = UnicodeSetStringSpan::spanBack(this->stringSpan,s,length,spanCondition);
    return iVar2;
  }
  if (this->strings->count != 0) {
    UnicodeSetStringSpan::UnicodeSetStringSpan
              (&strSpan,this,this->strings,0x1a - (spanCondition == USET_SPAN_NOT_CONTAINED));
    if (strSpan.maxLength16 != 0) {
      iVar2 = UnicodeSetStringSpan::spanBack(&strSpan,s,length,spanCondition);
    }
    UnicodeSetStringSpan::~UnicodeSetStringSpan(&strSpan);
    if (strSpan.maxLength16 != 0) {
      return iVar2;
    }
  }
  do {
    uVar4 = length - 1;
    c = (uint)(ushort)s[(long)length + -1];
    if (((1 < length) && ((c & 0xfc00) == 0xdc00)) &&
       ((s[(ulong)(uint)length - 2] & 0xfc00U) == 0xd800)) {
      uVar4 = length - 2;
      c = (uint)(ushort)s[(long)length + -1] + (uint)(ushort)s[(ulong)(uint)length - 2] * 0x400 +
          0xfca02400;
    }
    UVar1 = contains(this,c);
  } while (((uint)(spanCondition != USET_SPAN_NOT_CONTAINED) == (int)UVar1) &&
          (length = uVar4, 0 < (int)uVar4));
  return length;
}

Assistant:

int32_t UnicodeSet::spanBack(const UChar *s, int32_t length, USetSpanCondition spanCondition) const {
    if(length>0 && bmpSet!=NULL) {
        return (int32_t)(bmpSet->spanBack(s, s+length, spanCondition)-s);
    }
    if(length<0) {
        length=u_strlen(s);
    }
    if(length==0) {
        return 0;
    }
    if(stringSpan!=NULL) {
        return stringSpan->spanBack(s, length, spanCondition);
    } else if(!strings->isEmpty()) {
        uint32_t which= spanCondition==USET_SPAN_NOT_CONTAINED ?
                            UnicodeSetStringSpan::BACK_UTF16_NOT_CONTAINED :
                            UnicodeSetStringSpan::BACK_UTF16_CONTAINED;
        UnicodeSetStringSpan strSpan(*this, *strings, which);
        if(strSpan.needsStringSpanUTF16()) {
            return strSpan.spanBack(s, length, spanCondition);
        }
    }

    if(spanCondition!=USET_SPAN_NOT_CONTAINED) {
        spanCondition=USET_SPAN_CONTAINED;  // Pin to 0/1 values.
    }

    UChar32 c;
    int32_t prev=length;
    do {
        U16_PREV(s, 0, length, c);
        if(spanCondition!=contains(c)) {
            break;
        }
    } while((prev=length)>0);
    return prev;
}